

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar13;
  ulong uVar14;
  void *pvVar15;
  int *piVar16;
  long lVar17;
  uint uVar18;
  uint uVar19;
  Allocator *pAVar20;
  long lVar21;
  uint uVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float in_XMM1_Da;
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  int iVar58;
  undefined1 auVar57 [16];
  void *ptr;
  void *local_40;
  size_t local_38;
  
  switch(this->operation) {
  case 0:
    iVar12 = reduction_op<std::plus<float>,std::plus<float>>
                       (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da,opt);
    return iVar12;
  case 1:
    iVar12 = this->dim;
    fVar1 = this->coeff;
    uVar18 = bottom_blob->w;
    lVar21 = (long)(int)uVar18;
    uVar14 = (ulong)uVar18;
    uVar19 = bottom_blob->h;
    uVar3 = bottom_blob->c;
    lVar13 = (long)(int)uVar3;
    sVar4 = bottom_blob->elemsize;
    if (iVar12 == 0) {
      pAVar20 = opt->blob_allocator;
      uVar29 = 1;
      goto LAB_001422d0;
    }
    switch(iVar12) {
    default:
      goto switchD_0014209d_caseD_0;
    case 1:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar3;
LAB_001422d0:
      Mat::create(top_blob,uVar29,sVar4,pAVar20);
      goto switchD_0014209d_caseD_0;
    case 2:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar3;
      uVar22 = uVar19;
      break;
    case -2:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar19;
      uVar22 = uVar18;
      break;
    case -1:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar18;
      goto LAB_001422d0;
    }
    Mat::create(top_blob,uVar22,uVar29,sVar4,pAVar20);
switchD_0014209d_caseD_0:
    pvVar15 = top_blob->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if (top_blob->cstep * (long)top_blob->c == 0) {
      return -100;
    }
    uVar29 = uVar19 * uVar18;
    if (iVar12 != 0) {
      switch(iVar12) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar3) {
          sVar4 = bottom_blob->elemsize;
          sVar6 = bottom_blob->cstep;
          pvVar23 = bottom_blob->data;
          lVar21 = 0;
          do {
            fVar47 = 0.0;
            if (0 < (int)uVar29) {
              uVar14 = 0;
              do {
                fVar47 = fVar47 + ABS(*(float *)((long)pvVar23 + uVar14 * 4));
                uVar14 = uVar14 + 1;
              } while (uVar29 != uVar14);
            }
            *(float *)((long)pvVar15 + lVar21 * 4) = fVar47 * fVar1;
            lVar21 = lVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
          } while (lVar21 != lVar13);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar3) {
          pvVar23 = bottom_blob->data;
          sVar4 = bottom_blob->elemsize;
          iVar12 = top_blob->w;
          sVar6 = top_blob->elemsize;
          sVar5 = bottom_blob->cstep;
          lVar24 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar27 = 0;
              pvVar25 = pvVar23;
              do {
                fVar47 = 0.0;
                if (0 < (int)uVar18) {
                  uVar30 = 0;
                  do {
                    fVar47 = fVar47 + ABS(*(float *)((long)pvVar25 + uVar30 * 4));
                    uVar30 = uVar30 + 1;
                  } while (uVar14 != uVar30);
                }
                *(float *)((long)pvVar15 + uVar27 * 4 + (long)iVar12 * sVar6 * lVar24) =
                     fVar47 * fVar1;
                uVar27 = uVar27 + 1;
                pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
              } while (uVar27 != uVar19);
            }
            lVar24 = lVar24 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar5);
          } while (lVar24 != lVar13);
          return 0;
        }
        return 0;
      case -2:
        uVar18 = (int)top_blob->cstep * top_blob->c;
        if (0 < (int)uVar18) {
          memset(pvVar15,0,(ulong)uVar18 << 2);
        }
        if (0 < (int)uVar3) {
          pvVar23 = bottom_blob->data;
          sVar4 = bottom_blob->elemsize;
          sVar6 = bottom_blob->cstep;
          pvVar25 = top_blob->data;
          lVar21 = 0;
          do {
            if (0 < (int)uVar29) {
              uVar14 = 0;
              do {
                *(float *)((long)pvVar25 + uVar14 * 4) =
                     ABS(*(float *)((long)pvVar23 + uVar14 * 4)) +
                     *(float *)((long)pvVar25 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar29 != uVar14);
            }
            lVar21 = lVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
          } while (lVar21 != lVar13);
        }
        if (0 < (int)uVar29) {
          uVar14 = 0;
          do {
            *(float *)((long)pvVar15 + uVar14 * 4) = *(float *)((long)pvVar15 + uVar14 * 4) * fVar1;
            uVar14 = uVar14 + 1;
          } while (uVar29 != uVar14);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_0014238f_caseD_ffffffff;
      }
    }
    pAVar20 = opt->workspace_allocator;
    if (uVar3 == 0) {
      piVar16 = (int *)0x0;
      pvVar15 = (void *)0x0;
    }
    else {
      uVar14 = sVar4 * lVar13 + 3 & 0xfffffffffffffffc;
      if (pAVar20 == (Allocator *)0x0) {
        local_40 = (void *)0x0;
        iVar12 = posix_memalign(&local_40,0x10,uVar14 + 4);
        pvVar15 = local_40;
        if (iVar12 != 0) {
          local_40 = (void *)0x0;
          pvVar15 = local_40;
        }
      }
      else {
        pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar14 + 4);
      }
      piVar16 = (int *)((long)pvVar15 + uVar14);
      *(undefined4 *)((long)pvVar15 + uVar14) = 1;
    }
    if ((uVar3 != 0) && (pvVar15 != (void *)0x0)) {
      if ((int)uVar3 < 1) {
        auVar37 = ZEXT816(0);
      }
      else {
        sVar4 = bottom_blob->elemsize;
        sVar6 = bottom_blob->cstep;
        pvVar23 = bottom_blob->data;
        lVar21 = 0;
        do {
          fVar47 = 0.0;
          if (0 < (int)uVar29) {
            uVar14 = 0;
            do {
              fVar47 = fVar47 + ABS(*(float *)((long)pvVar23 + uVar14 * 4));
              uVar14 = uVar14 + 1;
            } while (uVar29 != uVar14);
          }
          *(float *)((long)pvVar15 + lVar21 * 4) = fVar47;
          lVar21 = lVar21 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
        } while (lVar21 != lVar13);
        auVar37 = ZEXT816(0);
        if (0 < (int)uVar3) {
          lVar21 = 0;
          do {
            auVar37._0_4_ = auVar37._0_4_ + *(float *)((long)pvVar15 + lVar21 * 4);
            lVar21 = lVar21 + 1;
          } while (lVar13 != lVar21);
        }
      }
      *(float *)top_blob->data = auVar37._0_4_ * fVar1;
      if (piVar16 == (int *)0x0) {
        return 0;
      }
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) {
        return 0;
      }
      if (pAVar20 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
        return 0;
      }
      goto LAB_00144004;
    }
    if (piVar16 == (int *)0x0) {
      return -100;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return -100;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
      return -100;
    }
LAB_00143425:
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    goto LAB_00144016;
  case 2:
    iVar12 = this->dim;
    fVar1 = this->coeff;
    uVar18 = bottom_blob->w;
    lVar21 = (long)(int)uVar18;
    uVar14 = (ulong)uVar18;
    uVar19 = bottom_blob->h;
    uVar3 = bottom_blob->c;
    lVar13 = (long)(int)uVar3;
    sVar4 = bottom_blob->elemsize;
    if (iVar12 == 0) {
      pAVar20 = opt->blob_allocator;
      uVar29 = 1;
      goto LAB_00142117;
    }
    switch(iVar12) {
    default:
      goto switchD_00141f8f_caseD_0;
    case 1:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar3;
LAB_00142117:
      Mat::create(top_blob,uVar29,sVar4,pAVar20);
      goto switchD_00141f8f_caseD_0;
    case 2:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar3;
      uVar22 = uVar19;
      break;
    case -2:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar19;
      uVar22 = uVar18;
      break;
    case -1:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar18;
      goto LAB_00142117;
    }
    Mat::create(top_blob,uVar22,uVar29,sVar4,pAVar20);
switchD_00141f8f_caseD_0:
    pvVar15 = top_blob->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if (top_blob->cstep * (long)top_blob->c == 0) {
      return -100;
    }
    uVar29 = uVar19 * uVar18;
    if (iVar12 != 0) {
      switch(iVar12) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar3) {
          pvVar23 = bottom_blob->data;
          sVar4 = bottom_blob->elemsize;
          sVar6 = bottom_blob->cstep;
          lVar21 = 0;
          do {
            fVar47 = 0.0;
            if (0 < (int)uVar29) {
              uVar14 = 0;
              do {
                fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
                fVar47 = fVar47 + fVar2 * fVar2;
                uVar14 = uVar14 + 1;
              } while (uVar29 != uVar14);
            }
            *(float *)((long)pvVar15 + lVar21 * 4) = fVar47 * fVar1;
            lVar21 = lVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
          } while (lVar21 != lVar13);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar3) {
          sVar4 = bottom_blob->elemsize;
          iVar12 = top_blob->w;
          sVar6 = top_blob->elemsize;
          sVar5 = bottom_blob->cstep;
          pvVar23 = bottom_blob->data;
          lVar24 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar27 = 0;
              pvVar25 = pvVar23;
              do {
                auVar32 = ZEXT816(0);
                if (0 < (int)uVar18) {
                  uVar30 = 0;
                  do {
                    fVar47 = *(float *)((long)pvVar25 + uVar30 * 4);
                    auVar32._0_4_ = auVar32._0_4_ + fVar47 * fVar47;
                    uVar30 = uVar30 + 1;
                  } while (uVar14 != uVar30);
                }
                *(float *)((long)pvVar15 + uVar27 * 4 + (long)iVar12 * sVar6 * lVar24) =
                     auVar32._0_4_ * fVar1;
                uVar27 = uVar27 + 1;
                pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
              } while (uVar27 != uVar19);
            }
            lVar24 = lVar24 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar5);
          } while (lVar24 != lVar13);
          return 0;
        }
        return 0;
      case -2:
        uVar18 = (int)top_blob->cstep * top_blob->c;
        if (0 < (int)uVar18) {
          memset(pvVar15,0,(ulong)uVar18 << 2);
        }
        if (0 < (int)uVar3) {
          sVar4 = bottom_blob->elemsize;
          sVar6 = bottom_blob->cstep;
          pvVar23 = bottom_blob->data;
          pvVar25 = top_blob->data;
          lVar21 = 0;
          do {
            if (0 < (int)uVar29) {
              uVar14 = 0;
              do {
                fVar47 = *(float *)((long)pvVar23 + uVar14 * 4);
                *(float *)((long)pvVar25 + uVar14 * 4) =
                     fVar47 * fVar47 + *(float *)((long)pvVar25 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar29 != uVar14);
            }
            lVar21 = lVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
          } while (lVar21 != lVar13);
        }
        if (0 < (int)uVar29) {
          uVar14 = 0;
          do {
            *(float *)((long)pvVar15 + uVar14 * 4) = *(float *)((long)pvVar15 + uVar14 * 4) * fVar1;
            uVar14 = uVar14 + 1;
          } while (uVar29 != uVar14);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_001421d6_caseD_ffffffff;
      }
    }
    pAVar20 = opt->workspace_allocator;
    if (uVar3 == 0) {
      piVar16 = (int *)0x0;
      pvVar15 = (void *)0x0;
    }
    else {
      uVar14 = sVar4 * lVar13 + 3 & 0xfffffffffffffffc;
      if (pAVar20 == (Allocator *)0x0) {
        local_40 = (void *)0x0;
        iVar12 = posix_memalign(&local_40,0x10,uVar14 + 4);
        pvVar15 = local_40;
        if (iVar12 != 0) {
          local_40 = (void *)0x0;
          pvVar15 = local_40;
        }
      }
      else {
        pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar14 + 4);
      }
      piVar16 = (int *)((long)pvVar15 + uVar14);
      *(undefined4 *)((long)pvVar15 + uVar14) = 1;
    }
    if ((uVar3 != 0) && (pvVar15 != (void *)0x0)) {
      if ((int)uVar3 < 1) {
        auVar36 = ZEXT816(0);
      }
      else {
        pvVar23 = bottom_blob->data;
        sVar4 = bottom_blob->elemsize;
        sVar6 = bottom_blob->cstep;
        lVar21 = 0;
        do {
          fVar47 = 0.0;
          if (0 < (int)uVar29) {
            uVar14 = 0;
            do {
              fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
              fVar47 = fVar47 + fVar2 * fVar2;
              uVar14 = uVar14 + 1;
            } while (uVar29 != uVar14);
          }
          *(float *)((long)pvVar15 + lVar21 * 4) = fVar47;
          lVar21 = lVar21 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
        } while (lVar21 != lVar13);
        auVar36 = ZEXT816(0);
        if (0 < (int)uVar3) {
          lVar21 = 0;
          do {
            auVar36._0_4_ = auVar36._0_4_ + *(float *)((long)pvVar15 + lVar21 * 4);
            lVar21 = lVar21 + 1;
          } while (lVar13 != lVar21);
        }
      }
      *(float *)top_blob->data = auVar36._0_4_ * fVar1;
      if (piVar16 == (int *)0x0) {
        return 0;
      }
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) {
        return 0;
      }
      if (pAVar20 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
        return 0;
      }
      goto LAB_00144004;
    }
    if (piVar16 == (int *)0x0) {
      return -100;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return -100;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
      return -100;
    }
    goto LAB_00143425;
  case 3:
    iVar12 = reduction_op<std::plus<float>,std::plus<float>>
                       (bottom_blob,top_blob,this->coeff,this->dim,in_XMM1_Da,opt);
    if (iVar12 != 0) {
      return -100;
    }
    if (this->dim + 2U < 5) {
      uVar18 = bottom_blob->w;
      uVar19 = bottom_blob->h;
      uVar3 = bottom_blob->c;
      uVar29 = uVar19 * uVar18;
      switch(this->dim) {
      case 0:
        *(float *)top_blob->data = *top_blob->data / (float)(int)(uVar3 * uVar29);
        break;
      case 1:
        if (0 < (int)uVar3) {
          pvVar15 = top_blob->data;
          uVar14 = 0;
          do {
            *(float *)((long)pvVar15 + uVar14 * 4) =
                 *(float *)((long)pvVar15 + uVar14 * 4) * (1.0 / (float)(int)uVar29);
            uVar14 = uVar14 + 1;
          } while (uVar3 != uVar14);
        }
        break;
      case 2:
        if (0 < (int)uVar3) {
          sVar4 = top_blob->cstep;
          sVar6 = top_blob->elemsize;
          pvVar15 = top_blob->data;
          uVar14 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar27 = 0;
              do {
                *(float *)((long)pvVar15 + uVar27 * 4) =
                     *(float *)((long)pvVar15 + uVar27 * 4) * (1.0 / (float)(int)uVar18);
                uVar27 = uVar27 + 1;
              } while (uVar19 != uVar27);
            }
            uVar14 = uVar14 + 1;
            pvVar15 = (void *)((long)pvVar15 + sVar4 * sVar6);
          } while (uVar14 != uVar3);
        }
        break;
      case -2:
        if (0 < (int)uVar29) {
          pvVar15 = top_blob->data;
          uVar14 = 0;
          do {
            *(float *)((long)pvVar15 + uVar14 * 4) =
                 *(float *)((long)pvVar15 + uVar14 * 4) * (1.0 / (float)(int)uVar3);
            uVar14 = uVar14 + 1;
          } while (uVar29 != uVar14);
        }
        break;
      case -1:
        if (0 < (int)uVar18) {
          pvVar15 = top_blob->data;
          uVar14 = 0;
          do {
            *(float *)((long)pvVar15 + uVar14 * 4) =
                 *(float *)((long)pvVar15 + uVar14 * 4) * (1.0 / (float)(int)(uVar19 * uVar3));
            uVar14 = uVar14 + 1;
          } while (uVar18 != uVar14);
        }
      }
    }
  }
  iVar12 = this->operation;
  if (iVar12 != 6) {
    if (iVar12 != 5) {
      if (iVar12 != 4) {
        return 0;
      }
      iVar12 = this->dim;
      fVar1 = this->coeff;
      uVar18 = bottom_blob->w;
      lVar21 = (long)(int)uVar18;
      uVar14 = (ulong)uVar18;
      uVar19 = bottom_blob->h;
      uVar3 = bottom_blob->c;
      lVar13 = (long)(int)uVar3;
      sVar4 = bottom_blob->elemsize;
      if (iVar12 == 0) {
        pAVar20 = opt->blob_allocator;
        uVar29 = 1;
        goto LAB_00142cf2;
      }
      switch(iVar12) {
      default:
        goto switchD_001425d3_caseD_0;
      case 1:
        pAVar20 = opt->blob_allocator;
        uVar29 = uVar3;
LAB_00142cf2:
        Mat::create(top_blob,uVar29,sVar4,pAVar20);
        goto switchD_001425d3_caseD_0;
      case 2:
        pAVar20 = opt->blob_allocator;
        uVar29 = uVar3;
        uVar22 = uVar19;
        break;
      case -2:
        pAVar20 = opt->blob_allocator;
        uVar29 = uVar19;
        uVar22 = uVar18;
        break;
      case -1:
        pAVar20 = opt->blob_allocator;
        uVar29 = uVar18;
        goto LAB_00142cf2;
      }
      Mat::create(top_blob,uVar22,uVar29,sVar4,pAVar20);
switchD_001425d3_caseD_0:
      auVar40 = _DAT_001683e0;
      auVar11 = _DAT_001683d0;
      auVar57 = _DAT_00167c40;
      pvVar15 = top_blob->data;
      if (pvVar15 == (void *)0x0) {
        return -100;
      }
      if (top_blob->cstep * (long)top_blob->c == 0) {
        return -100;
      }
      uVar29 = uVar19 * uVar18;
      uVar27 = (ulong)uVar29;
      if (iVar12 != 0) {
        switch(iVar12) {
        default:
          return 0;
        case 1:
          if (0 < (int)uVar3) {
            sVar4 = bottom_blob->elemsize;
            sVar6 = bottom_blob->cstep;
            pvVar23 = bottom_blob->data;
            lVar21 = 0;
            do {
              fVar47 = -3.4028235e+38;
              if (0 < (int)uVar29) {
                uVar14 = 0;
                fVar47 = -3.4028235e+38;
                do {
                  fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
                  if (fVar47 <= fVar2) {
                    fVar47 = fVar2;
                  }
                  uVar14 = uVar14 + 1;
                } while (uVar27 != uVar14);
              }
              *(float *)((long)pvVar15 + lVar21 * 4) = fVar47 * fVar1;
              lVar21 = lVar21 + 1;
              pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
            } while (lVar21 != lVar13);
            return 0;
          }
          return 0;
        case 2:
          if (0 < (int)uVar3) {
            pvVar23 = bottom_blob->data;
            sVar4 = bottom_blob->elemsize;
            iVar12 = top_blob->w;
            sVar6 = top_blob->elemsize;
            sVar5 = bottom_blob->cstep;
            lVar24 = 0;
            do {
              if (0 < (int)uVar19) {
                uVar27 = 0;
                pvVar25 = pvVar23;
                do {
                  fVar47 = -3.4028235e+38;
                  if (0 < (int)uVar18) {
                    uVar30 = 0;
                    fVar47 = -3.4028235e+38;
                    do {
                      fVar2 = *(float *)((long)pvVar25 + uVar30 * 4);
                      if (fVar47 <= fVar2) {
                        fVar47 = fVar2;
                      }
                      uVar30 = uVar30 + 1;
                    } while (uVar14 != uVar30);
                  }
                  *(float *)((long)pvVar15 + uVar27 * 4 + (long)iVar12 * sVar6 * lVar24) =
                       fVar47 * fVar1;
                  uVar27 = uVar27 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
                } while (uVar27 != uVar19);
              }
              lVar24 = lVar24 + 1;
              pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar5);
            } while (lVar24 != lVar13);
            return 0;
          }
          return 0;
        case -2:
          uVar18 = (int)top_blob->cstep * top_blob->c;
          if (0 < (int)uVar18) {
            lVar21 = (ulong)uVar18 - 1;
            auVar35._8_4_ = (int)lVar21;
            auVar35._0_8_ = lVar21;
            auVar35._12_4_ = (int)((ulong)lVar21 >> 0x20);
            uVar14 = 0;
            auVar35 = auVar35 ^ _DAT_00167c40;
            do {
              auVar50._8_4_ = (int)uVar14;
              auVar50._0_8_ = uVar14;
              auVar50._12_4_ = (int)(uVar14 >> 0x20);
              auVar46 = (auVar50 | auVar40) ^ auVar57;
              iVar12 = auVar35._4_4_;
              if ((bool)(~(auVar46._4_4_ == iVar12 && auVar35._0_4_ < auVar46._0_4_ ||
                          iVar12 < auVar46._4_4_) & 1)) {
                *(undefined4 *)((long)pvVar15 + uVar14 * 4) = 0xff7fffff;
              }
              if ((auVar46._12_4_ != auVar35._12_4_ || auVar46._8_4_ <= auVar35._8_4_) &&
                  auVar46._12_4_ <= auVar35._12_4_) {
                *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 4) = 0xff7fffff;
              }
              auVar46 = (auVar50 | auVar11) ^ auVar57;
              iVar58 = auVar46._4_4_;
              if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar35._0_4_)) {
                *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 0xc) = 0xff7fffff;
              }
              uVar14 = uVar14 + 4;
            } while ((uVar18 + 3 & 0xfffffffc) != uVar14);
          }
          if (0 < (int)uVar3) {
            sVar4 = bottom_blob->elemsize;
            sVar6 = bottom_blob->cstep;
            pvVar23 = bottom_blob->data;
            pvVar25 = top_blob->data;
            lVar21 = 0;
            do {
              if (0 < (int)uVar29) {
                uVar14 = 0;
                do {
                  fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
                  fVar47 = *(float *)((long)pvVar25 + uVar14 * 4);
                  if (fVar2 <= fVar47) {
                    fVar2 = fVar47;
                  }
                  *(float *)((long)pvVar25 + uVar14 * 4) = fVar2;
                  uVar14 = uVar14 + 1;
                } while (uVar27 != uVar14);
              }
              lVar21 = lVar21 + 1;
              pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
            } while (lVar21 != lVar13);
          }
          if (0 < (int)uVar29) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar15 + uVar14 * 4) =
                   *(float *)((long)pvVar15 + uVar14 * 4) * fVar1;
              uVar14 = uVar14 + 1;
            } while (uVar27 != uVar14);
            return 0;
          }
          return 0;
        case -1:
          goto switchD_00142ff6_caseD_ffffffff;
        }
      }
      pAVar20 = opt->workspace_allocator;
      if (uVar3 == 0) {
        piVar16 = (int *)0x0;
        pvVar15 = (void *)0x0;
      }
      else {
        uVar14 = sVar4 * lVar13 + 3 & 0xfffffffffffffffc;
        if (pAVar20 == (Allocator *)0x0) {
          local_40 = (void *)0x0;
          iVar12 = posix_memalign(&local_40,0x10,uVar14 + 4);
          pvVar15 = local_40;
          if (iVar12 != 0) {
            local_40 = (void *)0x0;
            pvVar15 = local_40;
          }
        }
        else {
          pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar14 + 4);
        }
        piVar16 = (int *)((long)pvVar15 + uVar14);
        *(undefined4 *)((long)pvVar15 + uVar14) = 1;
      }
      if ((uVar3 == 0) || (pvVar15 == (void *)0x0)) {
        if (piVar16 == (int *)0x0) {
          return -100;
        }
        LOCK();
        *piVar16 = *piVar16 + -1;
        UNLOCK();
        if (*piVar16 != 0) {
          return -100;
        }
        if (pAVar20 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
          return -100;
        }
        goto joined_r0x00144011;
      }
      if ((int)uVar3 < 1) {
LAB_00143fc9:
        auVar40._0_12_ = ZEXT812(0xff7fffff);
        auVar40._12_4_ = 0;
      }
      else {
        sVar4 = bottom_blob->elemsize;
        sVar6 = bottom_blob->cstep;
        pvVar23 = bottom_blob->data;
        lVar21 = 0;
        do {
          fVar47 = -3.4028235e+38;
          if (0 < (int)uVar29) {
            uVar14 = 0;
            fVar47 = -3.4028235e+38;
            do {
              fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
              if (fVar47 <= fVar2) {
                fVar47 = fVar2;
              }
              uVar14 = uVar14 + 1;
            } while (uVar27 != uVar14);
          }
          *(float *)((long)pvVar15 + lVar21 * 4) = fVar47;
          lVar21 = lVar21 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
        } while (lVar21 != lVar13);
        if ((int)uVar3 < 1) goto LAB_00143fc9;
        auVar40._0_12_ = ZEXT812(0xff7fffff);
        auVar40._12_4_ = 0;
        lVar21 = 0;
        do {
          fVar47 = *(float *)((long)pvVar15 + lVar21 * 4);
          if (auVar40._0_4_ <= fVar47) {
            auVar40._0_4_ = fVar47;
          }
          lVar21 = lVar21 + 1;
        } while (lVar13 != lVar21);
      }
      *(float *)top_blob->data = auVar40._0_4_ * fVar1;
      if (piVar16 == (int *)0x0) {
        return 0;
      }
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) {
        return 0;
      }
      if (pAVar20 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
        return 0;
      }
      goto LAB_00144004;
    }
    iVar12 = this->dim;
    fVar1 = this->coeff;
    uVar18 = bottom_blob->w;
    lVar21 = (long)(int)uVar18;
    uVar14 = (ulong)uVar18;
    uVar19 = bottom_blob->h;
    uVar3 = bottom_blob->c;
    lVar13 = (long)(int)uVar3;
    sVar4 = bottom_blob->elemsize;
    if (iVar12 == 0) {
      pAVar20 = opt->blob_allocator;
      uVar29 = 1;
      goto LAB_00142a2c;
    }
    switch(iVar12) {
    default:
      goto switchD_0014263d_caseD_0;
    case 1:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar3;
LAB_00142a2c:
      Mat::create(top_blob,uVar29,sVar4,pAVar20);
      goto switchD_0014263d_caseD_0;
    case 2:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar3;
      uVar22 = uVar19;
      break;
    case -2:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar19;
      uVar22 = uVar18;
      break;
    case -1:
      pAVar20 = opt->blob_allocator;
      uVar29 = uVar18;
      goto LAB_00142a2c;
    }
    Mat::create(top_blob,uVar22,uVar29,sVar4,pAVar20);
switchD_0014263d_caseD_0:
    auVar40 = _DAT_001683e0;
    auVar11 = _DAT_001683d0;
    auVar57 = _DAT_00167c40;
    pvVar15 = top_blob->data;
    if (pvVar15 == (void *)0x0) {
      return -100;
    }
    if (top_blob->cstep * (long)top_blob->c == 0) {
      return -100;
    }
    uVar29 = uVar19 * uVar18;
    uVar27 = (ulong)uVar29;
    if (iVar12 != 0) {
      switch(iVar12) {
      default:
        return 0;
      case 1:
        if (0 < (int)uVar3) {
          sVar4 = bottom_blob->elemsize;
          sVar6 = bottom_blob->cstep;
          pvVar23 = bottom_blob->data;
          lVar21 = 0;
          do {
            fVar47 = 3.4028235e+38;
            if (0 < (int)uVar29) {
              uVar14 = 0;
              fVar47 = 3.4028235e+38;
              do {
                fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
                if (fVar2 <= fVar47) {
                  fVar47 = fVar2;
                }
                uVar14 = uVar14 + 1;
              } while (uVar27 != uVar14);
            }
            *(float *)((long)pvVar15 + lVar21 * 4) = fVar47 * fVar1;
            lVar21 = lVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
          } while (lVar21 != lVar13);
          return 0;
        }
        return 0;
      case 2:
        if (0 < (int)uVar3) {
          pvVar23 = bottom_blob->data;
          sVar4 = bottom_blob->elemsize;
          iVar12 = top_blob->w;
          sVar6 = top_blob->elemsize;
          sVar5 = bottom_blob->cstep;
          lVar24 = 0;
          do {
            if (0 < (int)uVar19) {
              uVar27 = 0;
              pvVar25 = pvVar23;
              do {
                fVar47 = 3.4028235e+38;
                if (0 < (int)uVar18) {
                  uVar30 = 0;
                  fVar47 = 3.4028235e+38;
                  do {
                    fVar2 = *(float *)((long)pvVar25 + uVar30 * 4);
                    if (fVar2 <= fVar47) {
                      fVar47 = fVar2;
                    }
                    uVar30 = uVar30 + 1;
                  } while (uVar14 != uVar30);
                }
                *(float *)((long)pvVar15 + uVar27 * 4 + (long)iVar12 * sVar6 * lVar24) =
                     fVar47 * fVar1;
                uVar27 = uVar27 + 1;
                pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
              } while (uVar27 != uVar19);
            }
            lVar24 = lVar24 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar5);
          } while (lVar24 != lVar13);
          return 0;
        }
        return 0;
      case -2:
        uVar18 = (int)top_blob->cstep * top_blob->c;
        if (0 < (int)uVar18) {
          lVar21 = (ulong)uVar18 - 1;
          auVar33._8_4_ = (int)lVar21;
          auVar33._0_8_ = lVar21;
          auVar33._12_4_ = (int)((ulong)lVar21 >> 0x20);
          uVar14 = 0;
          auVar33 = auVar33 ^ _DAT_00167c40;
          do {
            auVar48._8_4_ = (int)uVar14;
            auVar48._0_8_ = uVar14;
            auVar48._12_4_ = (int)(uVar14 >> 0x20);
            auVar46 = (auVar48 | auVar40) ^ auVar57;
            iVar12 = auVar33._4_4_;
            if ((bool)(~(auVar46._4_4_ == iVar12 && auVar33._0_4_ < auVar46._0_4_ ||
                        iVar12 < auVar46._4_4_) & 1)) {
              *(undefined4 *)((long)pvVar15 + uVar14 * 4) = 0x7f7fffff;
            }
            if ((auVar46._12_4_ != auVar33._12_4_ || auVar46._8_4_ <= auVar33._8_4_) &&
                auVar46._12_4_ <= auVar33._12_4_) {
              *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 4) = 0x7f7fffff;
            }
            auVar46 = (auVar48 | auVar11) ^ auVar57;
            iVar58 = auVar46._4_4_;
            if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar33._0_4_)) {
              *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 8) = 0x7f7fffff;
              *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 0xc) = 0x7f7fffff;
            }
            uVar14 = uVar14 + 4;
          } while ((uVar18 + 3 & 0xfffffffc) != uVar14);
        }
        if (0 < (int)uVar3) {
          sVar4 = bottom_blob->elemsize;
          sVar6 = bottom_blob->cstep;
          pvVar23 = bottom_blob->data;
          pvVar25 = top_blob->data;
          lVar21 = 0;
          do {
            if (0 < (int)uVar29) {
              uVar14 = 0;
              do {
                fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
                fVar47 = *(float *)((long)pvVar25 + uVar14 * 4);
                if (fVar47 <= fVar2) {
                  fVar2 = fVar47;
                }
                *(float *)((long)pvVar25 + uVar14 * 4) = fVar2;
                uVar14 = uVar14 + 1;
              } while (uVar27 != uVar14);
            }
            lVar21 = lVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
          } while (lVar21 != lVar13);
        }
        if (0 < (int)uVar29) {
          uVar14 = 0;
          do {
            *(float *)((long)pvVar15 + uVar14 * 4) = *(float *)((long)pvVar15 + uVar14 * 4) * fVar1;
            uVar14 = uVar14 + 1;
          } while (uVar27 != uVar14);
          return 0;
        }
        return 0;
      case -1:
        goto switchD_00142b24_caseD_ffffffff;
      }
    }
    pAVar20 = opt->workspace_allocator;
    if (uVar3 == 0) {
      piVar16 = (int *)0x0;
      pvVar15 = (void *)0x0;
    }
    else {
      uVar14 = sVar4 * lVar13 + 3 & 0xfffffffffffffffc;
      if (pAVar20 == (Allocator *)0x0) {
        local_40 = (void *)0x0;
        iVar12 = posix_memalign(&local_40,0x10,uVar14 + 4);
        pvVar15 = local_40;
        if (iVar12 != 0) {
          local_40 = (void *)0x0;
          pvVar15 = local_40;
        }
      }
      else {
        pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar14 + 4);
      }
      piVar16 = (int *)((long)pvVar15 + uVar14);
      *(undefined4 *)((long)pvVar15 + uVar14) = 1;
    }
    if ((uVar3 == 0) || (pvVar15 == (void *)0x0)) {
      if (piVar16 == (int *)0x0) {
        return -100;
      }
      LOCK();
      *piVar16 = *piVar16 + -1;
      UNLOCK();
      if (*piVar16 != 0) {
        return -100;
      }
      if (pAVar20 != (Allocator *)0x0) {
        (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
        return -100;
      }
      goto joined_r0x00144011;
    }
    if ((int)uVar3 < 1) {
LAB_00143d70:
      auVar38._0_12_ = ZEXT812(0x7f7fffff);
      auVar38._12_4_ = 0;
    }
    else {
      sVar4 = bottom_blob->elemsize;
      sVar6 = bottom_blob->cstep;
      pvVar23 = bottom_blob->data;
      lVar21 = 0;
      do {
        fVar47 = 3.4028235e+38;
        if (0 < (int)uVar29) {
          uVar14 = 0;
          fVar47 = 3.4028235e+38;
          do {
            fVar2 = *(float *)((long)pvVar23 + uVar14 * 4);
            if (fVar2 <= fVar47) {
              fVar47 = fVar2;
            }
            uVar14 = uVar14 + 1;
          } while (uVar27 != uVar14);
        }
        *(float *)((long)pvVar15 + lVar21 * 4) = fVar47;
        lVar21 = lVar21 + 1;
        pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
      } while (lVar21 != lVar13);
      if ((int)uVar3 < 1) goto LAB_00143d70;
      auVar38._0_12_ = ZEXT812(0x7f7fffff);
      auVar38._12_4_ = 0;
      lVar21 = 0;
      do {
        fVar47 = *(float *)((long)pvVar15 + lVar21 * 4);
        if (fVar47 <= auVar38._0_4_) {
          auVar38._0_4_ = fVar47;
        }
        lVar21 = lVar21 + 1;
      } while (lVar13 != lVar21);
    }
    *(float *)top_blob->data = auVar38._0_4_ * fVar1;
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
      return 0;
    }
    goto LAB_00144004;
  }
  iVar12 = this->dim;
  fVar1 = this->coeff;
  uVar18 = bottom_blob->w;
  lVar21 = (long)(int)uVar18;
  uVar14 = (ulong)uVar18;
  uVar19 = bottom_blob->h;
  uVar3 = bottom_blob->c;
  lVar13 = (long)(int)uVar3;
  sVar4 = bottom_blob->elemsize;
  if (iVar12 == 0) {
    pAVar20 = opt->blob_allocator;
    uVar29 = 1;
    goto LAB_00142a69;
  }
  switch(iVar12) {
  default:
    goto switchD_001426a3_caseD_0;
  case 1:
    pAVar20 = opt->blob_allocator;
    uVar29 = uVar3;
LAB_00142a69:
    Mat::create(top_blob,uVar29,sVar4,pAVar20);
    goto switchD_001426a3_caseD_0;
  case 2:
    pAVar20 = opt->blob_allocator;
    uVar29 = uVar3;
    uVar22 = uVar19;
    break;
  case -2:
    pAVar20 = opt->blob_allocator;
    uVar29 = uVar19;
    uVar22 = uVar18;
    break;
  case -1:
    pAVar20 = opt->blob_allocator;
    uVar29 = uVar18;
    goto LAB_00142a69;
  }
  Mat::create(top_blob,uVar22,uVar29,sVar4,pAVar20);
switchD_001426a3_caseD_0:
  auVar40 = _DAT_001683e0;
  auVar11 = _DAT_001683d0;
  auVar57 = _DAT_00167c40;
  pvVar15 = top_blob->data;
  if (pvVar15 == (void *)0x0) {
    return -100;
  }
  if (top_blob->cstep * (long)top_blob->c == 0) {
    return -100;
  }
  uVar29 = uVar19 * uVar18;
  uVar27 = (ulong)uVar29;
  if (iVar12 != 0) {
    switch(iVar12) {
    default:
      return 0;
    case 1:
      if (0 < (int)uVar3) {
        sVar4 = bottom_blob->elemsize;
        sVar6 = bottom_blob->cstep;
        pvVar23 = bottom_blob->data;
        lVar21 = 0;
        do {
          fVar47 = 1.0;
          if (0 < (int)uVar29) {
            uVar14 = 0;
            fVar47 = 1.0;
            do {
              fVar47 = fVar47 * *(float *)((long)pvVar23 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar27 != uVar14);
          }
          *(float *)((long)pvVar15 + lVar21 * 4) = fVar47 * fVar1;
          lVar21 = lVar21 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
        } while (lVar21 != lVar13);
        return 0;
      }
      return 0;
    case 2:
      if (0 < (int)uVar3) {
        pvVar23 = bottom_blob->data;
        sVar4 = bottom_blob->elemsize;
        iVar12 = top_blob->w;
        sVar6 = top_blob->elemsize;
        sVar5 = bottom_blob->cstep;
        lVar24 = 0;
        do {
          if (0 < (int)uVar19) {
            uVar27 = 0;
            pvVar25 = pvVar23;
            do {
              fVar47 = 1.0;
              if (0 < (int)uVar18) {
                uVar30 = 0;
                fVar47 = 1.0;
                do {
                  fVar47 = fVar47 * *(float *)((long)pvVar25 + uVar30 * 4);
                  uVar30 = uVar30 + 1;
                } while (uVar14 != uVar30);
              }
              *(float *)((long)pvVar15 + uVar27 * 4 + (long)iVar12 * sVar6 * lVar24) =
                   fVar47 * fVar1;
              uVar27 = uVar27 + 1;
              pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
            } while (uVar27 != uVar19);
          }
          lVar24 = lVar24 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar5);
        } while (lVar24 != lVar13);
        return 0;
      }
      return 0;
    case -2:
      uVar18 = (int)top_blob->cstep * top_blob->c;
      if (0 < (int)uVar18) {
        lVar21 = (ulong)uVar18 - 1;
        auVar34._8_4_ = (int)lVar21;
        auVar34._0_8_ = lVar21;
        auVar34._12_4_ = (int)((ulong)lVar21 >> 0x20);
        uVar14 = 0;
        auVar34 = auVar34 ^ _DAT_00167c40;
        do {
          auVar49._8_4_ = (int)uVar14;
          auVar49._0_8_ = uVar14;
          auVar49._12_4_ = (int)(uVar14 >> 0x20);
          auVar46 = (auVar49 | auVar40) ^ auVar57;
          iVar12 = auVar34._4_4_;
          if ((bool)(~(auVar46._4_4_ == iVar12 && auVar34._0_4_ < auVar46._0_4_ ||
                      iVar12 < auVar46._4_4_) & 1)) {
            *(undefined4 *)((long)pvVar15 + uVar14 * 4) = 0x3f800000;
          }
          if ((auVar46._12_4_ != auVar34._12_4_ || auVar46._8_4_ <= auVar34._8_4_) &&
              auVar46._12_4_ <= auVar34._12_4_) {
            *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 4) = 0x3f800000;
          }
          auVar46 = (auVar49 | auVar11) ^ auVar57;
          iVar58 = auVar46._4_4_;
          if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar34._0_4_)) {
            *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 8) = 0x3f800000;
            *(undefined4 *)((long)pvVar15 + uVar14 * 4 + 0xc) = 0x3f800000;
          }
          uVar14 = uVar14 + 4;
        } while ((uVar18 + 3 & 0xfffffffc) != uVar14);
      }
      if (0 < (int)uVar3) {
        sVar4 = bottom_blob->elemsize;
        sVar6 = bottom_blob->cstep;
        pvVar23 = bottom_blob->data;
        pvVar25 = top_blob->data;
        lVar21 = 0;
        do {
          if (0 < (int)uVar29) {
            uVar14 = 0;
            do {
              *(float *)((long)pvVar25 + uVar14 * 4) =
                   *(float *)((long)pvVar23 + uVar14 * 4) * *(float *)((long)pvVar25 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar27 != uVar14);
          }
          lVar21 = lVar21 + 1;
          pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
        } while (lVar21 != lVar13);
      }
      if (0 < (int)uVar29) {
        uVar14 = 0;
        do {
          *(float *)((long)pvVar15 + uVar14 * 4) = *(float *)((long)pvVar15 + uVar14 * 4) * fVar1;
          uVar14 = uVar14 + 1;
        } while (uVar27 != uVar14);
        return 0;
      }
      return 0;
    case -1:
      goto switchD_00142daa_caseD_ffffffff;
    }
  }
  pAVar20 = opt->workspace_allocator;
  if (uVar3 == 0) {
    piVar16 = (int *)0x0;
    pvVar15 = (void *)0x0;
  }
  else {
    uVar14 = sVar4 * lVar13 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar12 = posix_memalign(&local_40,0x10,uVar14 + 4);
      pvVar15 = local_40;
      if (iVar12 != 0) {
        local_40 = (void *)0x0;
        pvVar15 = local_40;
      }
    }
    else {
      pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar14 + 4);
    }
    piVar16 = (int *)((long)pvVar15 + uVar14);
    *(undefined4 *)((long)pvVar15 + uVar14) = 1;
  }
  if ((uVar3 != 0) && (pvVar15 != (void *)0x0)) {
    if ((int)uVar3 < 1) {
LAB_00143ea4:
      auVar39._0_12_ = ZEXT812(0x3f800000);
      auVar39._12_4_ = 0;
    }
    else {
      sVar4 = bottom_blob->elemsize;
      sVar6 = bottom_blob->cstep;
      pvVar23 = bottom_blob->data;
      lVar21 = 0;
      do {
        fVar47 = 1.0;
        if (0 < (int)uVar29) {
          uVar14 = 0;
          fVar47 = 1.0;
          do {
            fVar47 = fVar47 * *(float *)((long)pvVar23 + uVar14 * 4);
            uVar14 = uVar14 + 1;
          } while (uVar27 != uVar14);
        }
        *(float *)((long)pvVar15 + lVar21 * 4) = fVar47;
        lVar21 = lVar21 + 1;
        pvVar23 = (void *)((long)pvVar23 + sVar4 * sVar6);
      } while (lVar21 != lVar13);
      if ((int)uVar3 < 1) goto LAB_00143ea4;
      auVar39._0_12_ = ZEXT812(0x3f800000);
      auVar39._12_4_ = 0;
      lVar21 = 0;
      do {
        auVar39._0_4_ = auVar39._0_4_ * *(float *)((long)pvVar15 + lVar21 * 4);
        lVar21 = lVar21 + 1;
      } while (lVar13 != lVar21);
    }
    *(float *)top_blob->data = auVar39._0_4_ * fVar1;
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
      return 0;
    }
LAB_00144004:
    free(pvVar15);
    return 0;
  }
  if (piVar16 == (int *)0x0) {
    return -100;
  }
  LOCK();
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return -100;
  }
  if (pAVar20 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
    return -100;
  }
  goto joined_r0x00144011;
switchD_00142ff6_caseD_ffffffff:
  pAVar20 = opt->workspace_allocator;
  pvVar15 = (void *)0x0;
  auVar57._8_8_ = 0;
  auVar57._0_8_ = sVar4;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = sVar4 * lVar21 + 0xf & 0xfffffffffffffff0;
  lVar24 = SUB168(auVar11 / auVar57,0);
  lVar31 = lVar24 * lVar13;
  piVar16 = (int *)0x0;
  if (lVar31 != 0) {
    uVar27 = lVar31 * sVar4 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar12 = posix_memalign(&local_40,0x10,uVar27 + 4);
      pvVar15 = local_40;
      if (iVar12 != 0) {
        local_40 = (void *)0x0;
        pvVar15 = local_40;
      }
    }
    else {
      pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar27 + 4);
    }
    piVar16 = (int *)((long)pvVar15 + uVar27);
    *(undefined4 *)((long)pvVar15 + uVar27) = 1;
  }
  auVar56 = _DAT_001683e0;
  auVar46 = _DAT_001683d0;
  auVar40 = _DAT_00167c40;
  if ((lVar31 != 0) && (pvVar15 != (void *)0x0)) {
    uVar29 = SUB164(auVar11 / auVar57,0) * uVar3;
    if (0 < (int)uVar29) {
      lVar31 = (ulong)uVar29 - 1;
      auVar45._8_4_ = (int)lVar31;
      auVar45._0_8_ = lVar31;
      auVar45._12_4_ = (int)((ulong)lVar31 >> 0x20);
      uVar27 = 0;
      auVar45 = auVar45 ^ _DAT_00167c40;
      do {
        auVar55._8_4_ = (int)uVar27;
        auVar55._0_8_ = uVar27;
        auVar55._12_4_ = (int)(uVar27 >> 0x20);
        auVar57 = (auVar55 | auVar56) ^ auVar40;
        iVar12 = auVar45._4_4_;
        if ((bool)(~(auVar57._4_4_ == iVar12 && auVar45._0_4_ < auVar57._0_4_ ||
                    iVar12 < auVar57._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4) = 0xff7fffff;
        }
        if ((auVar57._12_4_ != auVar45._12_4_ || auVar57._8_4_ <= auVar45._8_4_) &&
            auVar57._12_4_ <= auVar45._12_4_) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 4) = 0xff7fffff;
        }
        auVar57 = (auVar55 | auVar46) ^ auVar40;
        iVar58 = auVar57._4_4_;
        if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar57._0_4_ <= auVar45._0_4_)) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 8) = 0xff7fffff;
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 0xc) = 0xff7fffff;
        }
        uVar27 = uVar27 + 4;
      } while ((uVar29 + 3 & 0xfffffffc) != uVar27);
    }
    if (0 < (int)uVar3) {
      pvVar23 = bottom_blob->data;
      sVar6 = bottom_blob->elemsize;
      sVar5 = bottom_blob->cstep;
      lVar31 = 0;
      do {
        if (0 < (int)uVar19) {
          lVar26 = lVar24 * sVar4 * lVar31;
          pvVar25 = (void *)(sVar6 * sVar5 * lVar31 + (long)pvVar23);
          uVar27 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar17 = 0;
              uVar30 = (ulong)uVar18;
              do {
                fVar2 = *(float *)((long)pvVar25 + uVar27 * 4);
                fVar47 = *(float *)((long)pvVar15 + lVar17 * 4 + lVar26);
                if (fVar2 <= fVar47) {
                  fVar2 = fVar47;
                }
                *(float *)((long)pvVar15 + lVar17 * 4 + lVar26) = fVar2;
                lVar17 = lVar17 + 1;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar19);
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != lVar13);
    }
    auVar40 = _DAT_001683e0;
    auVar11 = _DAT_001683d0;
    auVar57 = _DAT_00167c40;
    uVar19 = top_blob->c * (int)top_blob->cstep;
    if (0 < (int)uVar19) {
      pvVar23 = top_blob->data;
      lVar21 = (ulong)uVar19 - 1;
      auVar46._8_4_ = (int)lVar21;
      auVar46._0_8_ = lVar21;
      auVar46._12_4_ = (int)((ulong)lVar21 >> 0x20);
      uVar27 = 0;
      auVar46 = auVar46 ^ _DAT_00167c40;
      do {
        auVar56._8_4_ = (int)uVar27;
        auVar56._0_8_ = uVar27;
        auVar56._12_4_ = (int)(uVar27 >> 0x20);
        auVar45 = (auVar56 | auVar40) ^ auVar57;
        iVar12 = auVar46._4_4_;
        if ((bool)(~(auVar45._4_4_ == iVar12 && auVar46._0_4_ < auVar45._0_4_ ||
                    iVar12 < auVar45._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4) = 0xff7fffff;
        }
        if ((auVar45._12_4_ != auVar46._12_4_ || auVar45._8_4_ <= auVar46._8_4_) &&
            auVar45._12_4_ <= auVar46._12_4_) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 4) = 0xff7fffff;
        }
        auVar56 = (auVar56 | auVar11) ^ auVar57;
        iVar58 = auVar56._4_4_;
        if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar56._0_4_ <= auVar46._0_4_)) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 8) = 0xff7fffff;
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 0xc) = 0xff7fffff;
        }
        uVar27 = uVar27 + 4;
      } while ((uVar19 + 3 & 0xfffffffc) != uVar27);
    }
    if (0 < (int)uVar3) {
      pvVar23 = top_blob->data;
      lVar21 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar27 = 0;
          do {
            fVar2 = *(float *)((long)pvVar15 + uVar27 * 4 + lVar24 * sVar4 * lVar21);
            fVar47 = *(float *)((long)pvVar23 + uVar27 * 4);
            if (fVar2 <= fVar47) {
              fVar2 = fVar47;
            }
            *(float *)((long)pvVar23 + uVar27 * 4) = fVar2;
            uVar27 = uVar27 + 1;
          } while (uVar14 != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar13);
    }
    if (0 < (int)uVar18) {
      pvVar23 = top_blob->data;
      uVar27 = 0;
      do {
        *(float *)((long)pvVar23 + uVar27 * 4) = *(float *)((long)pvVar23 + uVar27 * 4) * fVar1;
        uVar27 = uVar27 + 1;
      } while (uVar14 != uVar27);
    }
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))();
      return 0;
    }
    goto LAB_00144004;
  }
  if (piVar16 == (int *)0x0) {
    return -100;
  }
  LOCK();
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return -100;
  }
  if (pAVar20 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar20 + 0x18))();
    return -100;
  }
  goto joined_r0x00144011;
switchD_00142b24_caseD_ffffffff:
  pAVar20 = opt->workspace_allocator;
  pvVar15 = (void *)0x0;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar4;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = sVar4 * lVar21 + 0xf & 0xfffffffffffffff0;
  lVar24 = SUB168(auVar9 / auVar7,0);
  lVar31 = lVar24 * lVar13;
  piVar16 = (int *)0x0;
  if (lVar31 != 0) {
    uVar27 = lVar31 * sVar4 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar12 = posix_memalign(&local_40,0x10,uVar27 + 4);
      pvVar15 = local_40;
      if (iVar12 != 0) {
        local_40 = (void *)0x0;
        pvVar15 = local_40;
      }
    }
    else {
      pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar27 + 4);
    }
    piVar16 = (int *)((long)pvVar15 + uVar27);
    *(undefined4 *)((long)pvVar15 + uVar27) = 1;
  }
  auVar40 = _DAT_001683e0;
  auVar11 = _DAT_001683d0;
  auVar57 = _DAT_00167c40;
  if ((lVar31 != 0) && (pvVar15 != (void *)0x0)) {
    uVar29 = SUB164(auVar9 / auVar7,0) * uVar3;
    if (0 < (int)uVar29) {
      lVar31 = (ulong)uVar29 - 1;
      auVar41._8_4_ = (int)lVar31;
      auVar41._0_8_ = lVar31;
      auVar41._12_4_ = (int)((ulong)lVar31 >> 0x20);
      uVar27 = 0;
      auVar41 = auVar41 ^ _DAT_00167c40;
      do {
        auVar51._8_4_ = (int)uVar27;
        auVar51._0_8_ = uVar27;
        auVar51._12_4_ = (int)(uVar27 >> 0x20);
        auVar46 = (auVar51 | auVar40) ^ auVar57;
        iVar12 = auVar41._4_4_;
        if ((bool)(~(auVar46._4_4_ == iVar12 && auVar41._0_4_ < auVar46._0_4_ ||
                    iVar12 < auVar46._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4) = 0x7f7fffff;
        }
        if ((auVar46._12_4_ != auVar41._12_4_ || auVar46._8_4_ <= auVar41._8_4_) &&
            auVar46._12_4_ <= auVar41._12_4_) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 4) = 0x7f7fffff;
        }
        auVar46 = (auVar51 | auVar11) ^ auVar57;
        iVar58 = auVar46._4_4_;
        if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar41._0_4_)) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 8) = 0x7f7fffff;
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 0xc) = 0x7f7fffff;
        }
        uVar27 = uVar27 + 4;
      } while ((uVar29 + 3 & 0xfffffffc) != uVar27);
    }
    if (0 < (int)uVar3) {
      pvVar23 = bottom_blob->data;
      sVar6 = bottom_blob->elemsize;
      sVar5 = bottom_blob->cstep;
      lVar31 = 0;
      do {
        if (0 < (int)uVar19) {
          lVar26 = lVar24 * sVar4 * lVar31;
          pvVar25 = (void *)(sVar6 * sVar5 * lVar31 + (long)pvVar23);
          uVar27 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar17 = 0;
              uVar30 = (ulong)uVar18;
              do {
                fVar2 = *(float *)((long)pvVar25 + uVar27 * 4);
                fVar47 = *(float *)((long)pvVar15 + lVar17 * 4 + lVar26);
                if (fVar47 <= fVar2) {
                  fVar2 = fVar47;
                }
                *(float *)((long)pvVar15 + lVar17 * 4 + lVar26) = fVar2;
                lVar17 = lVar17 + 1;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar19);
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != lVar13);
    }
    auVar40 = _DAT_001683e0;
    auVar11 = _DAT_001683d0;
    auVar57 = _DAT_00167c40;
    uVar19 = top_blob->c * (int)top_blob->cstep;
    if (0 < (int)uVar19) {
      pvVar23 = top_blob->data;
      lVar21 = (ulong)uVar19 - 1;
      auVar42._8_4_ = (int)lVar21;
      auVar42._0_8_ = lVar21;
      auVar42._12_4_ = (int)((ulong)lVar21 >> 0x20);
      uVar27 = 0;
      auVar42 = auVar42 ^ _DAT_00167c40;
      do {
        auVar52._8_4_ = (int)uVar27;
        auVar52._0_8_ = uVar27;
        auVar52._12_4_ = (int)(uVar27 >> 0x20);
        auVar46 = (auVar52 | auVar40) ^ auVar57;
        iVar12 = auVar42._4_4_;
        if ((bool)(~(auVar46._4_4_ == iVar12 && auVar42._0_4_ < auVar46._0_4_ ||
                    iVar12 < auVar46._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4) = 0x7f7fffff;
        }
        if ((auVar46._12_4_ != auVar42._12_4_ || auVar46._8_4_ <= auVar42._8_4_) &&
            auVar46._12_4_ <= auVar42._12_4_) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 4) = 0x7f7fffff;
        }
        auVar46 = (auVar52 | auVar11) ^ auVar57;
        iVar58 = auVar46._4_4_;
        if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar42._0_4_)) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 8) = 0x7f7fffff;
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 0xc) = 0x7f7fffff;
        }
        uVar27 = uVar27 + 4;
      } while ((uVar19 + 3 & 0xfffffffc) != uVar27);
    }
    if (0 < (int)uVar3) {
      pvVar23 = top_blob->data;
      lVar21 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar27 = 0;
          do {
            fVar2 = *(float *)((long)pvVar15 + uVar27 * 4 + lVar24 * sVar4 * lVar21);
            fVar47 = *(float *)((long)pvVar23 + uVar27 * 4);
            if (fVar47 <= fVar2) {
              fVar2 = fVar47;
            }
            *(float *)((long)pvVar23 + uVar27 * 4) = fVar2;
            uVar27 = uVar27 + 1;
          } while (uVar14 != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar13);
    }
    if (0 < (int)uVar18) {
      pvVar23 = top_blob->data;
      uVar27 = 0;
      do {
        *(float *)((long)pvVar23 + uVar27 * 4) = *(float *)((long)pvVar23 + uVar27 * 4) * fVar1;
        uVar27 = uVar27 + 1;
      } while (uVar14 != uVar27);
    }
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))();
      return 0;
    }
    goto LAB_00144004;
  }
  if (piVar16 == (int *)0x0) {
    return -100;
  }
  LOCK();
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return -100;
  }
  if (pAVar20 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar20 + 0x18))();
    return -100;
  }
  goto joined_r0x00144011;
switchD_00142daa_caseD_ffffffff:
  pAVar20 = opt->workspace_allocator;
  pvVar15 = (void *)0x0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = sVar4;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = sVar4 * lVar21 + 0xf & 0xfffffffffffffff0;
  lVar24 = SUB168(auVar10 / auVar8,0);
  lVar31 = lVar24 * lVar13;
  piVar16 = (int *)0x0;
  if (lVar31 != 0) {
    uVar27 = lVar31 * sVar4 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar12 = posix_memalign(&local_40,0x10,uVar27 + 4);
      pvVar15 = local_40;
      if (iVar12 != 0) {
        local_40 = (void *)0x0;
        pvVar15 = local_40;
      }
    }
    else {
      pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))(pAVar20,uVar27 + 4);
    }
    piVar16 = (int *)((long)pvVar15 + uVar27);
    *(undefined4 *)((long)pvVar15 + uVar27) = 1;
  }
  auVar40 = _DAT_001683e0;
  auVar11 = _DAT_001683d0;
  auVar57 = _DAT_00167c40;
  if ((lVar31 != 0) && (pvVar15 != (void *)0x0)) {
    uVar29 = SUB164(auVar10 / auVar8,0) * uVar3;
    if (0 < (int)uVar29) {
      lVar31 = (ulong)uVar29 - 1;
      auVar43._8_4_ = (int)lVar31;
      auVar43._0_8_ = lVar31;
      auVar43._12_4_ = (int)((ulong)lVar31 >> 0x20);
      uVar27 = 0;
      auVar43 = auVar43 ^ _DAT_00167c40;
      do {
        auVar53._8_4_ = (int)uVar27;
        auVar53._0_8_ = uVar27;
        auVar53._12_4_ = (int)(uVar27 >> 0x20);
        auVar46 = (auVar53 | auVar40) ^ auVar57;
        iVar12 = auVar43._4_4_;
        if ((bool)(~(auVar46._4_4_ == iVar12 && auVar43._0_4_ < auVar46._0_4_ ||
                    iVar12 < auVar46._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4) = 0x3f800000;
        }
        if ((auVar46._12_4_ != auVar43._12_4_ || auVar46._8_4_ <= auVar43._8_4_) &&
            auVar46._12_4_ <= auVar43._12_4_) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 4) = 0x3f800000;
        }
        auVar46 = (auVar53 | auVar11) ^ auVar57;
        iVar58 = auVar46._4_4_;
        if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar43._0_4_)) {
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 8) = 0x3f800000;
          *(undefined4 *)((long)pvVar15 + uVar27 * 4 + 0xc) = 0x3f800000;
        }
        uVar27 = uVar27 + 4;
      } while ((uVar29 + 3 & 0xfffffffc) != uVar27);
    }
    if (0 < (int)uVar3) {
      pvVar23 = bottom_blob->data;
      sVar6 = bottom_blob->elemsize;
      sVar5 = bottom_blob->cstep;
      lVar31 = 0;
      do {
        if (0 < (int)uVar19) {
          lVar26 = lVar24 * sVar4 * lVar31;
          pvVar25 = (void *)(sVar6 * sVar5 * lVar31 + (long)pvVar23);
          uVar27 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar17 = 0;
              uVar30 = (ulong)uVar18;
              do {
                *(float *)((long)pvVar15 + lVar17 * 4 + lVar26) =
                     *(float *)((long)pvVar25 + uVar27 * 4) *
                     *(float *)((long)pvVar15 + lVar17 * 4 + lVar26);
                lVar17 = lVar17 + 1;
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
            }
            pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
            uVar27 = uVar27 + 1;
          } while (uVar27 != uVar19);
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != lVar13);
    }
    auVar40 = _DAT_001683e0;
    auVar11 = _DAT_001683d0;
    auVar57 = _DAT_00167c40;
    uVar19 = top_blob->c * (int)top_blob->cstep;
    if (0 < (int)uVar19) {
      pvVar23 = top_blob->data;
      lVar21 = (ulong)uVar19 - 1;
      auVar44._8_4_ = (int)lVar21;
      auVar44._0_8_ = lVar21;
      auVar44._12_4_ = (int)((ulong)lVar21 >> 0x20);
      uVar27 = 0;
      auVar44 = auVar44 ^ _DAT_00167c40;
      do {
        auVar54._8_4_ = (int)uVar27;
        auVar54._0_8_ = uVar27;
        auVar54._12_4_ = (int)(uVar27 >> 0x20);
        auVar46 = (auVar54 | auVar40) ^ auVar57;
        iVar12 = auVar44._4_4_;
        if ((bool)(~(auVar46._4_4_ == iVar12 && auVar44._0_4_ < auVar46._0_4_ ||
                    iVar12 < auVar46._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4) = 0x3f800000;
        }
        if ((auVar46._12_4_ != auVar44._12_4_ || auVar46._8_4_ <= auVar44._8_4_) &&
            auVar46._12_4_ <= auVar44._12_4_) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 4) = 0x3f800000;
        }
        auVar46 = (auVar54 | auVar11) ^ auVar57;
        iVar58 = auVar46._4_4_;
        if (iVar58 <= iVar12 && (iVar58 != iVar12 || auVar46._0_4_ <= auVar44._0_4_)) {
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 8) = 0x3f800000;
          *(undefined4 *)((long)pvVar23 + uVar27 * 4 + 0xc) = 0x3f800000;
        }
        uVar27 = uVar27 + 4;
      } while ((uVar19 + 3 & 0xfffffffc) != uVar27);
    }
    if (0 < (int)uVar3) {
      pvVar23 = top_blob->data;
      lVar21 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar27 = 0;
          do {
            *(float *)((long)pvVar23 + uVar27 * 4) =
                 *(float *)((long)pvVar15 + uVar27 * 4 + lVar24 * sVar4 * lVar21) *
                 *(float *)((long)pvVar23 + uVar27 * 4);
            uVar27 = uVar27 + 1;
          } while (uVar14 != uVar27);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar13);
    }
    if (0 < (int)uVar18) {
      pvVar23 = top_blob->data;
      uVar27 = 0;
      do {
        *(float *)((long)pvVar23 + uVar27 * 4) = *(float *)((long)pvVar23 + uVar27 * 4) * fVar1;
        uVar27 = uVar27 + 1;
      } while (uVar14 != uVar27);
    }
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))();
      return 0;
    }
    goto LAB_00144004;
  }
  if (piVar16 == (int *)0x0) {
    return -100;
  }
  LOCK();
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return -100;
  }
  if (pAVar20 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar20 + 0x18))();
    return -100;
  }
  goto joined_r0x00144011;
switchD_0014238f_caseD_ffffffff:
  pAVar20 = opt->workspace_allocator;
  pvVar15 = (void *)0x0;
  uVar27 = (sVar4 * lVar21 + 0xf & 0xfffffffffffffff0) / sVar4;
  lVar24 = uVar27 * lVar13;
  piVar16 = (int *)0x0;
  local_38 = sVar4;
  if (lVar24 != 0) {
    uVar30 = lVar24 * sVar4 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar12 = posix_memalign(&local_40,0x10,uVar30 + 4);
      pvVar15 = local_40;
      if (iVar12 != 0) {
        local_40 = (void *)0x0;
        pvVar15 = local_40;
      }
    }
    else {
      pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))();
    }
    piVar16 = (int *)((long)pvVar15 + uVar30);
    *(undefined4 *)((long)pvVar15 + uVar30) = 1;
  }
  if ((lVar24 != 0) && (pvVar15 != (void *)0x0)) {
    uVar29 = (int)uVar27 * uVar3;
    if (0 < (int)uVar29) {
      memset(pvVar15,0,(ulong)uVar29 << 2);
    }
    if (0 < (int)uVar3) {
      pvVar23 = bottom_blob->data;
      sVar4 = bottom_blob->elemsize;
      sVar6 = bottom_blob->cstep;
      lVar24 = 0;
      uVar29 = (uint)DAT_00168640;
      do {
        if (0 < (int)uVar19) {
          lVar31 = uVar27 * local_38 * lVar24;
          pvVar25 = (void *)(sVar4 * sVar6 * lVar24 + (long)pvVar23);
          uVar30 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar26 = 0;
              uVar28 = (ulong)uVar18;
              do {
                *(float *)((long)pvVar15 + lVar26 * 4 + lVar31) =
                     (float)(*(uint *)((long)pvVar25 + uVar30 * 4) & uVar29) +
                     *(float *)((long)pvVar15 + lVar26 * 4 + lVar31);
                lVar26 = lVar26 + 1;
                uVar28 = uVar28 - 1;
              } while (uVar28 != 0);
            }
            pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar19);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != lVar13);
    }
    uVar19 = top_blob->c * (int)top_blob->cstep;
    if (0 < (int)uVar19) {
      memset(top_blob->data,0,(ulong)uVar19 << 2);
    }
    if (0 < (int)uVar3) {
      pvVar23 = top_blob->data;
      lVar21 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar30 = 0;
          do {
            *(float *)((long)pvVar23 + uVar30 * 4) =
                 *(float *)((long)pvVar15 + uVar30 * 4 + uVar27 * local_38 * lVar21) +
                 *(float *)((long)pvVar23 + uVar30 * 4);
            uVar30 = uVar30 + 1;
          } while (uVar14 != uVar30);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar13);
    }
    if (0 < (int)uVar18) {
      pvVar23 = top_blob->data;
      uVar27 = 0;
      do {
        *(float *)((long)pvVar23 + uVar27 * 4) = *(float *)((long)pvVar23 + uVar27 * 4) * fVar1;
        uVar27 = uVar27 + 1;
      } while (uVar14 != uVar27);
    }
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
      return 0;
    }
    goto LAB_00144004;
  }
  if (piVar16 == (int *)0x0) {
    return -100;
  }
  LOCK();
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return -100;
  }
  if (pAVar20 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
    return -100;
  }
  goto joined_r0x00144011;
switchD_001421d6_caseD_ffffffff:
  pAVar20 = opt->workspace_allocator;
  pvVar15 = (void *)0x0;
  uVar27 = (sVar4 * lVar21 + 0xf & 0xfffffffffffffff0) / sVar4;
  lVar24 = uVar27 * lVar13;
  piVar16 = (int *)0x0;
  local_38 = sVar4;
  if (lVar24 != 0) {
    uVar30 = lVar24 * sVar4 + 3 & 0xfffffffffffffffc;
    if (pAVar20 == (Allocator *)0x0) {
      local_40 = (void *)0x0;
      iVar12 = posix_memalign(&local_40,0x10,uVar30 + 4);
      pvVar15 = local_40;
      if (iVar12 != 0) {
        local_40 = (void *)0x0;
        pvVar15 = local_40;
      }
    }
    else {
      pvVar15 = (void *)(**(code **)(*(long *)pAVar20 + 0x10))();
    }
    piVar16 = (int *)((long)pvVar15 + uVar30);
    *(undefined4 *)((long)pvVar15 + uVar30) = 1;
  }
  if ((lVar24 != 0) && (pvVar15 != (void *)0x0)) {
    uVar29 = (int)uVar27 * uVar3;
    if (0 < (int)uVar29) {
      memset(pvVar15,0,(ulong)uVar29 << 2);
    }
    if (0 < (int)uVar3) {
      pvVar23 = bottom_blob->data;
      sVar4 = bottom_blob->elemsize;
      sVar6 = bottom_blob->cstep;
      lVar24 = 0;
      do {
        if (0 < (int)uVar19) {
          lVar31 = uVar27 * local_38 * lVar24;
          pvVar25 = (void *)(sVar4 * sVar6 * lVar24 + (long)pvVar23);
          uVar30 = 0;
          do {
            if (0 < (int)uVar18) {
              lVar26 = 0;
              uVar28 = (ulong)uVar18;
              do {
                fVar47 = *(float *)((long)pvVar25 + uVar30 * 4);
                *(float *)((long)pvVar15 + lVar26 * 4 + lVar31) =
                     fVar47 * fVar47 + *(float *)((long)pvVar15 + lVar26 * 4 + lVar31);
                lVar26 = lVar26 + 1;
                uVar28 = uVar28 - 1;
              } while (uVar28 != 0);
            }
            pvVar25 = (void *)((long)pvVar25 + lVar21 * 4);
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar19);
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != lVar13);
    }
    uVar19 = top_blob->c * (int)top_blob->cstep;
    if (0 < (int)uVar19) {
      memset(top_blob->data,0,(ulong)uVar19 << 2);
    }
    if (0 < (int)uVar3) {
      pvVar23 = top_blob->data;
      lVar21 = 0;
      do {
        if (0 < (int)uVar18) {
          uVar30 = 0;
          do {
            *(float *)((long)pvVar23 + uVar30 * 4) =
                 *(float *)((long)pvVar15 + uVar30 * 4 + uVar27 * local_38 * lVar21) +
                 *(float *)((long)pvVar23 + uVar30 * 4);
            uVar30 = uVar30 + 1;
          } while (uVar14 != uVar30);
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 != lVar13);
    }
    if (0 < (int)uVar18) {
      pvVar23 = top_blob->data;
      uVar27 = 0;
      do {
        *(float *)((long)pvVar23 + uVar27 * 4) = *(float *)((long)pvVar23 + uVar27 * 4) * fVar1;
        uVar27 = uVar27 + 1;
      } while (uVar14 != uVar27);
    }
    if (piVar16 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar16 = *piVar16 + -1;
    UNLOCK();
    if (*piVar16 != 0) {
      return 0;
    }
    if (pAVar20 != (Allocator *)0x0) {
      (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
      return 0;
    }
    goto LAB_00144004;
  }
  if (piVar16 == (int *)0x0) {
    return -100;
  }
  LOCK();
  *piVar16 = *piVar16 + -1;
  UNLOCK();
  if (*piVar16 != 0) {
    return -100;
  }
  if (pAVar20 != (Allocator *)0x0) {
    (**(code **)(*(long *)pAVar20 + 0x18))(pAVar20,pvVar15);
    return -100;
  }
joined_r0x00144011:
  if (pvVar15 != (void *)0x0) {
LAB_00144016:
    free(pvVar15);
  }
  return -100;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff, opt);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff, opt);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff, opt);

    return 0;
}